

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operator.h
# Opt level: O0

Specification * __thiscall
ExprEval::Operator::Specification::get_symbol_abi_cxx11_(Specification *this)

{
  long in_RSI;
  Specification *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)(in_RSI + 8));
  return this;
}

Assistant:

virtual std::string get_symbol() const{ return symbol; }